

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O2

void * parseString(SymbolContext<char> *ctx)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  string *psVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  pvVar1 = ctx->context->m_window;
  lVar2 = ctx->symbol->start;
  lVar3 = ctx->symbol->end;
  pcVar8 = (char *)((long)pvVar1 + lVar3);
  lVar3 = lVar3 - lVar2;
  for (pcVar6 = (char *)((long)pvVar1 + lVar2);
      (pcVar7 = pcVar8, lVar3 != 0 && (pcVar7 = pcVar6, *pcVar6 != '\"')); pcVar6 = pcVar6 + 1) {
    lVar3 = lVar3 + -1;
  }
  pcVar7 = pcVar7 + 1;
  for (; (pcVar6 = pcVar7, pcVar8 != pcVar7 && (pcVar6 = pcVar8, *pcVar8 != '\"'));
      pcVar8 = pcVar8 + -1) {
  }
  puVar4 = (undefined4 *)operator_new(0x10);
  psVar5 = (string *)operator_new(0x20);
  *(string **)psVar5 = psVar5 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar5,pcVar7,pcVar7 + ((int)pcVar6 - (int)pcVar7));
  *puVar4 = 2;
  *(string **)(puVar4 + 2) = psVar5;
  return puVar4;
}

Assistant:

JSONValue(JSONValue&& old)
        : type(old.type)
    {
        switch (type)
        {
        case JSONType::Boolean: bvalue = old.bvalue; break;
        case JSONType::Number: dvalue = old.dvalue; break;
        case JSONType::String: svalue = old.svalue; old.svalue = nullptr; break;
        case JSONType::List: lvalue = old.lvalue; old.lvalue = nullptr; break;
        case JSONType::Object: ovalue = old.ovalue; old.ovalue = nullptr; break;
        }
    }